

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_unary_exp(SyntaxAnalyze *this)

{
  vector<front::word::Word,_std::allocator<front::word::Word>_> *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ExpressNode *pEVar9;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  OperationType OVar12;
  SyntaxAnalyze *in_RSI;
  pointer pWVar13;
  _Alloc_hider _Var14;
  ExpressNode *__tmp_1;
  _Base_ptr p_Var15;
  ExpressNode *__tmp;
  SharedExNdPtr SVar16;
  string num;
  SharedExNdPtr child;
  undefined1 local_138 [40];
  element_type *local_110;
  undefined1 local_108 [40];
  SharedExNdPtr local_e0;
  SharedExNdPtr local_d0;
  SharedExNdPtr local_c0;
  SharedExNdPtr local_b0;
  SharedExNdPtr local_a0;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  *(undefined8 *)this = 0;
  this->matched_index = 0;
  uVar10 = in_RSI->matched_index + 1;
  pWVar13 = (in_RSI->word_list->
            super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar8 = ((long)(in_RSI->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pWVar13 >> 4) * -0x5555555555555555;
  if (uVar10 < uVar8) {
    bVar5 = word::Word::match_token(pWVar13 + uVar10,LPARENT);
    if (bVar5) {
      match_one_word(in_RSI,LPARENT);
      gm_exp((SyntaxAnalyze *)local_138);
      *(undefined8 *)this = local_138._0_8_;
      this->matched_index = local_138._8_8_;
      match_one_word(in_RSI,RPARENT);
      _Var11._M_pi = extraout_RDX;
      goto LAB_001a33fc;
    }
    pWVar13 = (in_RSI->word_list->
              super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar10 = in_RSI->matched_index + 1;
    uVar8 = ((long)(in_RSI->word_list->
                   super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pWVar13 >> 4) *
            -0x5555555555555555;
  }
  if (uVar10 < uVar8) {
    bVar5 = word::Word::match_token(pWVar13 + uVar10,IDENFR);
    pvVar1 = in_RSI->word_list;
    if (!bVar5) {
      pWVar13 = (pvVar1->super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar10 = in_RSI->matched_index + 1;
      uVar8 = ((long)(pvVar1->
                     super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pWVar13 >> 4) *
              -0x5555555555555555;
      goto LAB_001a2db4;
    }
    uVar8 = in_RSI->matched_index + 2;
    pWVar13 = (pvVar1->super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((uVar8 < (ulong)(((long)(pvVar1->
                                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar13 >> 4) *
                        -0x5555555555555555)) &&
       (bVar5 = word::Word::match_token(pWVar13 + uVar8,LPARENT), bVar5)) {
      SVar16 = gm_func_call((SyntaxAnalyze *)local_138);
      _Var11 = SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    }
    else {
      SVar16 = gm_l_val((SyntaxAnalyze *)local_138,(ValueMode)in_RSI);
      _Var11 = SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    }
    uVar4 = local_138._8_8_;
    uVar3 = local_138._0_8_;
    local_138._0_8_ = (undefined1 *)0x0;
    local_138._8_8_ = (element_type *)0x0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
    *(undefined8 *)this = uVar3;
    this->matched_index = uVar4;
    if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a33fc;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    _Var11._M_pi = extraout_RDX_03;
    local_110 = (element_type *)local_138._8_8_;
  }
  else {
LAB_001a2db4:
    if ((uVar10 < uVar8) && (bVar5 = word::Word::match_token(pWVar13 + uVar10,INTCON), bVar5)) {
      local_138._8_8_ = 0;
      local_138[0x10] = 0;
      local_138._0_8_ = local_138 + 0x10;
      match_one_word(in_RSI,INTCON);
      word::Word::get_self_abi_cxx11_
                ((string *)local_108,
                 (in_RSI->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start + in_RSI->matched_index);
      std::__cxx11::string::operator=((string *)local_138,(string *)local_108);
      if ((ExpressNode *)local_108._0_8_ != (ExpressNode *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      pEVar9 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar9);
      local_108._0_8_ = pEVar9;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),pEVar9);
      uVar4 = local_108._8_8_;
      uVar3 = local_108._0_8_;
      local_108._0_8_ = (pointer)0x0;
      local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(undefined8 *)this = uVar3;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
      this->matched_index = uVar4;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      }
      local_90._0_8_ = (_Base_ptr)(local_90 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_138._0_8_,
                 (undefined1 *)(local_138._0_8_ + local_138._8_8_));
      iVar6 = word::stringToInt((string *)local_90);
      *(int *)(uVar3 + 8) = iVar6;
      _Var11._M_pi = extraout_RDX_00;
      if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        _Var11._M_pi = extraout_RDX_01;
      }
      *(undefined8 *)uVar3 = 0x400000000;
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
        _Var11._M_pi = extraout_RDX_02;
      }
      goto LAB_001a33fc;
    }
    pEVar9 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(pEVar9);
    local_138._0_8_ = pEVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),pEVar9);
    uVar4 = local_138._8_8_;
    uVar3 = local_138._0_8_;
    local_138._0_8_ = (undefined1 *)0x0;
    local_138._8_8_ = (element_type *)0x0;
    *(undefined8 *)this = uVar3;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
    this->matched_index = uVar4;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
       (element_type *)local_138._8_8_ != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    bVar5 = try_word(in_RSI,1,PLUS,MINU,NOT);
    if (bVar5) {
      uVar8 = in_RSI->matched_index + 1;
      pWVar13 = (in_RSI->word_list->
                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = ((long)(in_RSI->word_list->
                      super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pWVar13 >> 4) *
               -0x5555555555555555;
      if (uVar8 < uVar10) {
        bVar5 = word::Word::match_token(pWVar13 + uVar8,PLUS);
        if (bVar5) {
          match_one_word(in_RSI,PLUS);
          *(OperationType *)(uVar3 + 4) = UN_PLUS;
          goto LAB_001a2ffd;
        }
        pWVar13 = (in_RSI->word_list->
                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        uVar8 = in_RSI->matched_index + 1;
        uVar10 = ((long)(in_RSI->word_list->
                        super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pWVar13 >> 4) *
                 -0x5555555555555555;
      }
      if ((uVar8 < uVar10) && (bVar5 = word::Word::match_token(pWVar13 + uVar8,MINU), bVar5)) {
        OVar12 = UN_MINU;
        match_one_word(in_RSI,MINU);
      }
      else {
        OVar12 = UN_NOT;
        match_one_word(in_RSI,NOT);
      }
      *(OperationType *)(uVar3 + 4) = OVar12;
    }
    else if (*(OperationType *)(uVar3 + 4) == UN_PLUS) {
LAB_001a2ffd:
      SVar16 = gm_unary_exp((SyntaxAnalyze *)local_138);
      _Var11 = SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      *(undefined8 *)this = local_138._0_8_;
      this->matched_index = local_138._8_8_;
      local_110 = (element_type *)uVar4;
      goto joined_r0x001a3012;
    }
    gm_unary_exp((SyntaxAnalyze *)(local_138 + 0x20));
    if (*(int *)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                 local_138._32_8_)->_M_ptr == 0) {
      *(NodeType *)uVar3 = CNS;
      if (*(OperationType *)(uVar3 + 4) == UN_MINU) {
        uVar7 = -*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138._32_8_ + 8))->
                          _M_pi;
      }
      else {
        if (*(OperationType *)(uVar3 + 4) != UN_NOT) goto LAB_001a33a3;
        uVar7 = (uint)(*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                (local_138._32_8_ + 8))->_M_pi == 0);
      }
      *(uint *)(uVar3 + 8) = uVar7;
    }
    else {
      local_138._0_8_ = local_138 + 0x10;
      local_138._8_8_ = (element_type *)0x0;
      local_138[0x10] = 0;
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((string *)local_108,&in_RSI->irGenerator,Int);
      std::__cxx11::string::operator=((string *)local_138,(string *)local_108);
      if ((ExpressNode *)local_108._0_8_ != (ExpressNode *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      *(NodeType *)uVar3 = VAR;
      std::__cxx11::string::_M_assign((string *)(uVar3 + 0x10));
      pEVar9 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar9);
      local_108._0_8_ = pEVar9;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),pEVar9);
      uVar4 = local_108._0_8_;
      *(undefined8 *)local_108._0_8_ = 0x400000000;
      *(int *)(local_108._0_8_ + 8) = 0;
      if (*(OperationType *)(uVar3 + 4) == UN_MINU) {
        p_Var15 = (_Base_ptr)&local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)p_Var15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_138._0_8_,
                   (undefined1 *)(local_138._0_8_ + (long)(_func_int ***)local_138._8_8_));
        local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)uVar4;
        local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
        if ((_Base_ptr)local_108._8_8_ != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
          }
        }
        local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110;
        if (local_110 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(local_110->_name)._M_dataplus._M_p =
                 *(int *)&(local_110->_name)._M_dataplus._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(local_110->_name)._M_dataplus._M_p =
                 *(int *)&(local_110->_name)._M_dataplus._M_p + 1;
          }
        }
        hp_gn_binary_mir(in_RSI,&local_50,&local_a0,&local_b0,Sub);
        if ((element_type *)
            local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        _Var14._M_p = local_50._M_dataplus._M_p;
        if ((_Base_ptr)
            local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var14._M_p = local_50._M_dataplus._M_p;
        }
      }
      else {
        p_Var15 = (_Base_ptr)(local_70 + 0x10);
        local_70._0_8_ = p_Var15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,local_138._0_8_,
                   (undefined1 *)(local_138._0_8_ + (long)(_func_int ***)local_138._8_8_));
        local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)uVar4;
        local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
        if ((_Base_ptr)local_108._8_8_ != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
          }
        }
        local_d0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110;
        if (local_110 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(local_110->_name)._M_dataplus._M_p =
                 *(int *)&(local_110->_name)._M_dataplus._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(local_110->_name)._M_dataplus._M_p =
                 *(int *)&(local_110->_name)._M_dataplus._M_p + 1;
          }
        }
        hp_gn_binary_mir(in_RSI,(string *)local_70,&local_c0,&local_d0,Eq);
        if ((element_type *)
            local_d0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        _Var14._M_p = (pointer)local_70._0_8_;
        if (local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var14._M_p = (pointer)local_70._0_8_;
        }
      }
      if ((_Base_ptr)_Var14._M_p != p_Var15) {
        operator_delete(_Var14._M_p,*(size_type *)p_Var15 + 1);
      }
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,CONCAT71(local_138._17_7_,local_138[0x10]) + 1);
      }
      if ((_Base_ptr)local_108._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      }
    }
LAB_001a33a3:
    pEVar9 = *(ExpressNode **)this;
    local_e0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_138._32_8_;
    local_e0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110;
    if (local_110 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_110->_name)._M_dataplus._M_p =
             *(int *)&(local_110->_name)._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&(local_110->_name)._M_dataplus._M_p =
             *(int *)&(local_110->_name)._M_dataplus._M_p + 1;
      }
    }
    express::ExpressNode::addChild(pEVar9,&local_e0);
    _Var11._M_pi = extraout_RDX_04;
    if ((element_type *)
        local_e0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var11._M_pi = extraout_RDX_05;
    }
  }
joined_r0x001a3012:
  if (local_110 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110);
    _Var11._M_pi = extraout_RDX_06;
  }
LAB_001a33fc:
  SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var11._M_pi;
  SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_unary_exp() {
  SharedExNdPtr node;

  if (try_word(1, Token::LPARENT)) {
    match_one_word(Token::LPARENT);

    node = gm_exp();

    match_one_word(Token::RPARENT);
  } else if (try_word(1, Token::IDENFR)) {
    if (try_word(2, Token::LPARENT)) {
      node = gm_func_call();
    } else {
      node = gm_l_val(ValueMode::right);
    }
  } else if (try_word(1, Token::INTCON)) {
    string num;
    match_one_word(Token::INTCON);
    num = get_least_matched_word().get_self();
    node = SharedExNdPtr(new ExpressNode());
    node->_value = front::word::stringToInt(num);
    node->_type = NodeType::CNS;
    node->_operation = OperationType::NUMBER;
  } else {
    node = SharedExNdPtr(new ExpressNode());
    if (try_word(1, Token::PLUS, Token::MINU, Token::NOT)) {
      if (try_word(1, Token::PLUS)) {
        match_one_word(Token::PLUS);
        node->_operation = OperationType::UN_PLUS;
      } else if (try_word(1, Token::MINU)) {
        match_one_word(Token::MINU);
        node->_operation = OperationType::UN_MINU;
      } else {
        match_one_word(Token::NOT);
        node->_operation = OperationType::UN_NOT;
      }
    }

    if (node->_operation == OperationType::UN_PLUS) {
      node = gm_unary_exp();
    } else {
      SharedExNdPtr child = gm_unary_exp();

      if (child->_type == NodeType::CNS) {
        node->_type = NodeType::CNS;
        switch (node->_operation) {
          case OperationType::UN_MINU:
            node->_value = -child->_value;
            break;
          case OperationType::UN_NOT:
            node->_value = !child->_value;
            break;
          default:
            break;
        }
      } else {
        SharedExNdPtr tmp;
        string nodeId;

        nodeId = irGenerator.getNewTmpValueName(TyKind::Int);
        node->_type = NodeType::VAR;
        node->_name = nodeId;

        tmp = SharedExNdPtr(new ExpressNode());
        tmp->_type = NodeType::CNS;
        tmp->_operation = OperationType::NUMBER;
        tmp->_value = 0;

        if (node->_operation == OperationType::UN_MINU) {
          hp_gn_binary_mir(nodeId, tmp, child, Op::Sub);
        } else {
          hp_gn_binary_mir(nodeId, tmp, child, Op::Eq);
        }
      }
      node->addChild(child);
    }
  }
  return node;
}